

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyVertices
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  bool bVar1;
  QGraphicsLayoutItem *pQVar2;
  long lVar3;
  qsizetype qVar4;
  const_reference ppAVar5;
  AnchorData *pAVar6;
  AnchorVertex *pAVar7;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  AnchorVertex *layoutVertex;
  bool feasible;
  AnchorData *ad_1;
  int i_1;
  AnchorData *ad;
  AnchorVertex *adjacent;
  int i;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *nextAdjacents;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *vAdjacents;
  AnchorVertexPair *newV;
  bool zeroSized;
  bool bothLayoutVertices;
  AnchorData *data;
  int index;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *g;
  QGraphicsAnchorLayout *q;
  AnchorVertex *adjacent_1;
  AnchorVertex *next;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> adjacents;
  AnchorVertex *v;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*> visited;
  QStack<QtGraphicsAnchorLayout::AnchorVertex_*> stack;
  undefined4 in_stack_fffffffffffffe78;
  Orientation in_stack_fffffffffffffe7c;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  AnchorVertex *in_stack_fffffffffffffe88;
  AnchorVertexPair *in_stack_fffffffffffffe90;
  AnchorVertex *in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  byte bVar8;
  undefined1 uVar9;
  Orientation orientation_00;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  uint uVar10;
  AnchorVertex *in_stack_fffffffffffffec0;
  Orientation in_stack_fffffffffffffecc;
  Orientation orientation_01;
  QGraphicsAnchorLayoutPrivate *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int local_10c;
  int local_dc;
  byte local_b1;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_90;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_78;
  AnchorVertex *local_60;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  AnchorVertex *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QGraphicsLayoutItem *)q_func(in_RDI);
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
              *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QStack<QtGraphicsAnchorLayout::AnchorVertex_*>::QStack
            ((QStack<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93a881);
  QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
            ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c
            );
  QStack<QtGraphicsAnchorLayout::AnchorVertex_*>::push
            ((QStack<QtGraphicsAnchorLayout::AnchorVertex_*> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (AnchorVertex **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93a8c5);
  while (bVar1 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::isEmpty
                           ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93a8d2),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_30 = QStack<QtGraphicsAnchorLayout::AnchorVertex_*>::pop
                         ((QStack<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93a8ea);
    QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
              ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe98,
               (AnchorVertex **)in_stack_fffffffffffffe90);
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                      *)in_stack_fffffffffffffe88,
                     (AnchorVertex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_dc = 0;
    while( true ) {
      lVar3 = (long)local_dc;
      qVar4 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_58);
      if (qVar4 <= lVar3) break;
      ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                          ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                           CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_60 = *ppAVar5;
      local_dc = local_dc + 1;
      pAVar6 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                        (AnchorVertex *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (AnchorVertex *)in_stack_fffffffffffffed0);
      uVar9 = false;
      if (local_30->m_item == pQVar2) {
        uVar9 = local_60->m_item == pQVar2;
      }
      bVar8 = 0;
      if ((pAVar6->minSize == 0.0) && (!NAN(pAVar6->minSize))) {
        bVar8 = pAVar6->maxSize != 0.0 ^ 0xff;
      }
      if (((bool)uVar9 == false) && ((bVar8 & 1) != 0)) {
        pAVar7 = (AnchorVertex *)operator_new(0x68);
        QtGraphicsAnchorLayout::AnchorVertexPair::AnchorVertexPair
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (AnchorVertex *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   (AnchorData *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        in_stack_fffffffffffffe98 = pAVar7;
        QHVContainer<QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>_>::operator[]
                  ((QHVContainer<QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>_> *)
                   CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c);
        QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>::append
                  ((QList<QtGraphicsAnchorLayout::AnchorVertexPair_*> *)0x93aaf6,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
        adjacentVertices((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                          *)in_stack_fffffffffffffe88,
                         (AnchorVertex *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
        adjacentVertices((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                          *)in_stack_fffffffffffffe88,
                         (AnchorVertex *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_10c = 0;
        while( true ) {
          in_stack_fffffffffffffe90 = (AnchorVertexPair *)(long)local_10c;
          qVar4 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_78);
          if (qVar4 <= (long)in_stack_fffffffffffffe90) break;
          ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (*ppAVar5 != local_60) {
            Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
            edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                      *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (AnchorVertex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (AnchorVertex *)in_stack_fffffffffffffed0);
            QList<QtGraphicsAnchorLayout::AnchorData_*>::append
                      ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x93abfe,
                       (parameter_type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                      );
          }
          local_10c = local_10c + 1;
        }
        in_stack_fffffffffffffedc = 0;
        while( true ) {
          in_stack_fffffffffffffe88 = (AnchorVertex *)(long)in_stack_fffffffffffffedc;
          qVar4 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_90);
          orientation_00 = (Orientation)((ulong)lVar3 >> 0x20);
          if (qVar4 <= (long)in_stack_fffffffffffffe88) break;
          ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (*ppAVar5 != local_30) {
            in_stack_fffffffffffffed0 =
                 (QGraphicsAnchorLayoutPrivate *)
                 Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                           *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                          (AnchorVertex *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (AnchorVertex *)in_stack_fffffffffffffed0);
            QList<QtGraphicsAnchorLayout::AnchorData_*>::append
                      ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x93aca7,
                       (parameter_type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                      );
            bVar1 = QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex*>::
                    contains<QtGraphicsAnchorLayout::AnchorVertex*>
                              ((QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                               (AnchorVertex **)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            if (!bVar1) {
              QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                        ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93acd5,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            }
          }
          in_stack_fffffffffffffedc = in_stack_fffffffffffffedc + 1;
        }
        bVar1 = replaceVertex(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                              in_stack_fffffffffffffec0,
                              (AnchorVertex *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              (QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI);
        orientation_01 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffecc);
        bVar1 = replaceVertex(in_stack_fffffffffffffed0,orientation_01,in_stack_fffffffffffffec0,
                              (AnchorVertex *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              (QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI);
        in_stack_fffffffffffffecc =
             CONCAT13(((byte)(orientation_01 >> 0x18) & 1 & bVar1) != 0,(int3)orientation_01);
        in_stack_fffffffffffffec0 = local_30;
        if ((local_30->m_item != pQVar2) &&
           (in_stack_fffffffffffffec0 = (AnchorVertex *)0x0, local_60->m_item == pQVar2)) {
          in_stack_fffffffffffffec0 = local_60;
        }
        if (in_stack_fffffffffffffec0 != (AnchorVertex *)0x0) {
          pAVar7->m_item = pQVar2;
          changeLayoutVertex(in_RDI,orientation_00,
                             (AnchorVertex *)
                             CONCAT17(uVar9,CONCAT16(bVar8,in_stack_fffffffffffffea0)),
                             in_stack_fffffffffffffe98);
        }
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
                  ((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                    *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (AnchorVertex *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        bVar1 = (in_stack_fffffffffffffecc & 0x1000000) != 0;
        if (bVar1) {
          local_30 = pAVar7;
          QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
                    ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe98,
                     (AnchorVertex **)in_stack_fffffffffffffe90);
        }
        else {
          local_b1 = 0;
        }
        uVar10 = (uint)!bVar1;
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
                  ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93ae7a);
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
                  ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93ae87);
        if (uVar10 != 0) goto LAB_0093aee9;
        in_stack_fffffffffffffebc = 0;
      }
      else {
        bVar1 = QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::contains
                          ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                           CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           (AnchorVertex **)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        if ((!bVar1) &&
           (bVar1 = QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex*>::
                    contains<QtGraphicsAnchorLayout::AnchorVertex*>
                              ((QListSpecialMethodsBase<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                               (AnchorVertex **)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
           !bVar1)) {
          QStack<QtGraphicsAnchorLayout::AnchorVertex_*>::push
                    ((QStack<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                     CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (AnchorVertex **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
          ;
        }
      }
    }
    uVar10 = 0;
LAB_0093aee9:
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93aef6);
    if (uVar10 != 0) goto LAB_0093af15;
    in_stack_fffffffffffffebc = 0;
  }
  local_b1 = 1;
LAB_0093af15:
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::~QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93af22);
  QStack<QtGraphicsAnchorLayout::AnchorVertex_*>::~QStack
            ((QStack<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93af2f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_b1 & 1);
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyVertices(Qt::Orientation orientation)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    // We'll walk through vertices
    QStack<AnchorVertex *> stack;
    stack.push(layoutFirstVertex[orientation]);
    QSet<AnchorVertex *> visited;

    while (!stack.isEmpty()) {
        AnchorVertex *v = stack.pop();
        visited.insert(v);

        // Each adjacent of 'v' is a possible vertex to be merged. So we traverse all of
        // them. Since once a merge is made, we might add new adjacents, and we don't want to
        // pass two times through one adjacent. The 'index' is used to track our position.
        QList<AnchorVertex *> adjacents = g.adjacentVertices(v);
        int index = 0;

        while (index < adjacents.size()) {
            AnchorVertex *next = adjacents.at(index);
            index++;

            AnchorData *data = g.edgeData(v, next);
            const bool bothLayoutVertices = v->m_item == q && next->m_item == q;
            const bool zeroSized = !data->minSize && !data->maxSize;

            if (!bothLayoutVertices && zeroSized) {

                // Create a new vertex pair, note that we keep a list of those vertices so we can
                // easily process them when restoring the graph.
                AnchorVertexPair *newV = new AnchorVertexPair(v, next, data);
                simplifiedVertices[orientation].append(newV);

                // Collect the anchors of both vertices, the new vertex pair will take their place
                // in those anchors
                const QList<AnchorVertex *> &vAdjacents = g.adjacentVertices(v);
                const QList<AnchorVertex *> &nextAdjacents = g.adjacentVertices(next);

                for (int i = 0; i < vAdjacents.size(); ++i) {
                    AnchorVertex *adjacent = vAdjacents.at(i);
                    if (adjacent != next) {
                        AnchorData *ad = g.edgeData(v, adjacent);
                        newV->m_firstAnchors.append(ad);
                    }
                }

                for (int i = 0; i < nextAdjacents.size(); ++i) {
                    AnchorVertex *adjacent = nextAdjacents.at(i);
                    if (adjacent != v) {
                        AnchorData *ad = g.edgeData(next, adjacent);
                        newV->m_secondAnchors.append(ad);

                        // We'll also add new vertices to the adjacent list of the new 'v', to be
                        // created as a vertex pair and replace the current one.
                        if (!adjacents.contains(adjacent))
                            adjacents.append(adjacent);
                    }
                }

                // ### merge this loop into the ones that calculated m_firstAnchors/m_secondAnchors?
                // Make newV take the place of v and next
                bool feasible = replaceVertex(orientation, v, newV, newV->m_firstAnchors);
                feasible &= replaceVertex(orientation, next, newV, newV->m_secondAnchors);

                // Update the layout vertex information if one of the vertices is a layout vertex.
                AnchorVertex *layoutVertex = nullptr;
                if (v->m_item == q)
                    layoutVertex = v;
                else if (next->m_item == q)
                    layoutVertex = next;

                if (layoutVertex) {
                    // Layout vertices always have m_item == q...
                    newV->m_item = q;
                    changeLayoutVertex(orientation, layoutVertex, newV);
                }

                g.takeEdge(v, next);

                // If a non-feasibility is found, we leave early and cancel the simplification
                if (!feasible)
                    return false;

                v = newV;
                visited.insert(newV);

            } else if (!visited.contains(next) && !stack.contains(next)) {
                // If the adjacent is not fit for merge and it wasn't visited by the outermost
                // loop, we add it to the stack.
                stack.push(next);
            }
        }
    }

    return true;
}